

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-binary-reader.cc
# Opt level: O3

void __thiscall BinaryReader_DisabledOpcodes_Test::TestBody(BinaryReader_DisabledOpcodes_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Enum EVar3;
  Opcode opcode;
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  BinaryReaderError reader;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  Opcode local_114;
  internal local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  Result local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined2 local_e4;
  undefined1 local_e2;
  uchar local_e1;
  uchar local_e0;
  uchar local_df;
  undefined1 local_de;
  AssertHelper local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  BinaryReaderDelegate local_b0;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  char *local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  ReadBinaryOptions local_58;
  
  local_58.features.exceptions_enabled_ = false;
  local_58.features.mutable_globals_enabled_ = true;
  local_58.features.sat_float_to_int_enabled_ = true;
  local_58.features.sign_extension_enabled_ = true;
  local_58.features.simd_enabled_ = true;
  local_58.features.threads_enabled_ = false;
  local_58.features.function_references_enabled_ = false;
  local_58.features.multi_value_enabled_ = true;
  local_58.features.tail_call_enabled_ = false;
  local_58.features.bulk_memory_enabled_ = true;
  local_58.features.reference_types_enabled_ = true;
  local_58.features.annotations_enabled_ = false;
  local_58.features.code_metadata_enabled_ = false;
  local_58.features.gc_enabled_ = false;
  local_58.features.memory64_enabled_ = false;
  local_58.features.multi_memory_enabled_ = false;
  local_58.features.extended_const_enabled_ = false;
  local_58.features.relaxed_simd_enabled_ = false;
  local_58.features.custom_page_sizes_enabled_ = false;
  local_58.log_stream = (Stream *)0x0;
  local_58.read_debug_names = false;
  local_58.stop_on_first_error = true;
  local_58.fail_on_custom_section_error = true;
  local_58.skip_function_bodies = false;
  EVar3 = Unreachable;
  do {
    local_114.enum_ = EVar3;
    bVar1 = wabt::Opcode::IsEnabled(&local_114,&local_58.features);
    if (!bVar1) {
      wabt::Opcode::GetBytes(&local_c8,&local_114);
      if (3 < (ulong)((long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start)) {
        __assert_fail("b.size() <= 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-binary-reader.cc"
                      ,0x34,"virtual void BinaryReader_DisabledOpcodes_Test::TestBody()");
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c8,3);
      local_f8 = 0x16d736100;
      uStack_f0 = 0x203000060010401;
      local_e8 = 0x70a0001;
      local_e4 = 0x501;
      local_e2 = 0;
      local_e1 = *local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_e0 = local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
      local_df = local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
      local_de = 0xb;
      local_b0.state = (State *)0x0;
      local_b0._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderError_0023bd18;
      local_a0 = 1;
      uStack_88 = 0;
      uStack_84 = 0;
      local_98 = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      local_78 = &local_68;
      local_70 = 0;
      local_68 = '\0';
      local_fc = wabt::ReadBinary(&local_f8,0x1b,&local_b0,&local_58);
      local_120._M_head_impl._0_4_ = 1;
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                (local_110,"Result::Error","result",(Enum *)&local_120,&local_fc);
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_120);
        pcVar2 = "";
        if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_108->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-binary-reader.cc"
                   ,0x43,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_120._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_120._M_head_impl + 8))();
        }
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      local_d0.data_._0_4_ = 0;
      local_120._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::find((char *)&local_78,0x1e311c,0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_110,"0u","message.find(\"unexpected opcode\")",(uint *)&local_d0,
                 (unsigned_long *)&local_120);
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_120);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_120._M_head_impl + 0x10),"Got error message: ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_120._M_head_impl + 0x10),local_78,local_70);
        pcVar2 = "";
        if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = (local_108->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-binary-reader.cc"
                   ,0x48,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if (local_120._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_120._M_head_impl + 8))();
        }
      }
      if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_108,local_108);
      }
      local_b0._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderError_0023bd18;
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    EVar3 = EVar3 + Nop;
  } while (EVar3 != Invalid);
  return;
}

Assistant:

TEST(BinaryReader, DisabledOpcodes) {
  // Use the default features.
  ReadBinaryOptions options;

  // Loop through all opcodes.
  for (uint32_t i = 0; i < static_cast<uint32_t>(Opcode::Invalid); ++i) {
    Opcode opcode(static_cast<Opcode::Enum>(i));
    if (opcode.IsEnabled(options.features)) {
      continue;
    }

    // Use a shorter name to make the clang-formatted table below look nicer.
    std::vector<uint8_t> b = opcode.GetBytes();
    assert(b.size() <= 3);
    b.resize(3);

    uint8_t data[] = {
        0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00,  // magic + version
        0x01, 0x04, 0x01, 0x60, 0x00, 0x00,  // type section: 1 type, (func)
        0x03, 0x02, 0x01, 0x00,              // func section: 1 func, type 0
        0x0a, 0x07, 0x01, 0x05, 0x00,        // code section: 1 func, 0 locals
        b[0], b[1], b[2],  // The instruction, padded with zeroes
        0x0b,              // end
    };
    const size_t size = sizeof(data);

    BinaryReaderError reader;
    Result result = ReadBinary(data, size, &reader, options);
    EXPECT_EQ(Result::Error, result);

    // This relies on the binary reader checking whether the opcode is allowed
    // before reading any further data needed by the instruction.
    const std::string& message = reader.first_error.message;
    EXPECT_EQ(0u, message.find("unexpected opcode"))
        << "Got error message: " << message;
  }
}